

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O2

vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
* cutout(vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
         *__return_storage_ptr__,tile_t *tile,rotation_e rotation)

{
  pointer pvVar1;
  int i;
  reference pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *__first;
  pointer __r;
  size_type __n;
  allocator_type local_4b;
  allocator_type local_4a;
  value_type local_49;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  rotated;
  
  local_49 = 'x';
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&rotated,8,&local_49,&local_4a);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,8,(value_type *)&rotated,&local_4b);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&rotated);
  __first = (tile->data)._M_elems[1]._M_elems + 1;
  __n = 0;
  for (lVar6 = 0x50; lVar6 != 0; lVar6 = lVar6 + -10) {
    pvVar2 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(__return_storage_ptr__,__n);
    __n = __n + 1;
    std::ranges::__copy_or_move<false,_const_char_*,_const_char_*,_char_*>
              (__first,__first + 8,
               (pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start);
    __first = __first + 10;
  }
  if (3 < (int)rotation) {
    pvVar1 = (__return_storage_ptr__->
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (__r = (__return_storage_ptr__->
               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __r != pvVar1; __r = __r + 1) {
      std::ranges::__reverse_fn::operator()<std::vector<char,_std::allocator<char>_>_&>
                ((__reverse_fn *)&std::ranges::reverse,__r);
    }
    rotation = rotation - FlipRot0;
  }
  for (lVar6 = 0; lVar6 != (int)rotation; lVar6 = lVar6 + 1) {
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::vector(&rotated,__return_storage_ptr__);
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      lVar4 = 0;
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        rotated.
        super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar3].
        super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [lVar5] = *(char *)(*(long *)((long)&(((__return_storage_ptr__->
                                               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<char,_std::allocator<char>_>).
                                             _M_impl.super__Vector_impl_data + lVar4) + (7 - lVar3))
        ;
        lVar4 = lVar4 + 0x18;
      }
    }
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::operator=(__return_storage_ptr__,&rotated);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector(&rotated);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<char>> cutout(const tile_t& tile, tile_t::rotation_e rotation) {
  auto len = tile_t::N-2;
  std::vector<std::vector<char>> cutout (len, std::vector<char>(len, 'x'));

  size_t i = 0;
  ranges::for_each(tile.data.cbegin() + 1, tile.data.cend() - 1, [&](const auto& row){
    ranges::copy(row.cbegin() + 1, row.cend() - 1, cutout.at(i++).begin());
  });

  auto steps = static_cast<int>(rotation);
  if (steps >= 4) {
    steps -= 4;
    ranges::for_each(cutout, [](auto& row){
      ranges::reverse(row);
    });
  }
  for (size_t rot = 0; rot < steps; rot++) {
    auto rotated = cutout;
    for (int i = 0; i < len; ++i) {
      for (int j = 0; j < len; ++j) {
        rotated[i][j] = cutout[j][len - i - 1];
      }
    }
    cutout = rotated;
  }

  return cutout;
}